

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O3

int P_TranslateSectorSpecial(int special)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  uint uVar8;
  
  uVar3 = SectorMasks.Count - 1;
  if ((int)uVar3 < 0) {
    uVar4 = 0;
  }
  else {
    piVar7 = &SectorMasks.Array[uVar3].shift;
    uVar4 = 0;
    lVar5 = (ulong)uVar3 + 1;
    do {
      uVar3 = ((FSectorMask *)(piVar7 + -2))->mask & special;
      if (uVar3 != 0) {
        iVar1 = piVar7[-1];
        if (iVar1 == -1) {
          uVar8 = (int)uVar3 >> ((byte)*piVar7 & 0x1f);
        }
        else {
          uVar8 = uVar3;
          if (iVar1 == 0) {
            if (*piVar7 == 1) {
              uVar8 = 0;
            }
          }
          else if (iVar1 == 1) {
            uVar8 = uVar3 << ((byte)*piVar7 & 0x1f);
          }
        }
        special = special ^ uVar3;
        uVar4 = uVar4 | uVar8;
      }
      piVar7 = piVar7 + -3;
      lVar6 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar2);
  }
  uVar3 = special;
  if (((uint)special < SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Count) &&
     ((SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[special].bitmask_allowed !=
       false || (uVar3 = 0, uVar4 == 0)))) {
    uVar3 = SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[special].newtype;
  }
  return uVar3 | uVar4;
}

Assistant:

int P_TranslateSectorSpecial (int special)
{
	int mask = 0;

	for(int i = SectorMasks.Size()-1; i>=0; i--)
	{
		int newmask = special & SectorMasks[i].mask;
		if (newmask)
		{
			special &= ~newmask;
			if (SectorMasks[i].op == 1)
				newmask <<= SectorMasks[i].shift;
			else if (SectorMasks[i].op == -1)
				newmask >>= SectorMasks[i].shift;
			else if (SectorMasks[i].op == 0 && SectorMasks[i].shift == 1)
				newmask = 0;
			mask |= newmask;
		}
	}
	
	if ((unsigned)special < SectorTranslations.Size())
	{
		if (!SectorTranslations[special].bitmask_allowed && mask)
			special = 0;
		else
			special = SectorTranslations[special].newtype;
	}
	return special | mask;
}